

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O1

ConnectionSyntax __thiscall
CPP::WriteInitialization::connectionSyntax
          (WriteInitialization *this,SignalSlot *sender,SignalSlot *receiver)

{
  long lVar1;
  long lVar2;
  char cVar3;
  bool bVar4;
  ConnectionSyntax CVar5;
  QStringView QVar6;
  QStringView QVar7;
  QLatin1String QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  
  CVar5 = MemberFunctionPtr;
  if ((*(uint *)this->m_option >> 9 & 1) == 0) {
    CVar5 = StringBased;
    if ((*(uint *)this->m_option >> 10 & 1) == 0) {
      if (connectionSyntax(language::SignalSlot_const&,language::SignalSlot_const&)::
          requiresStringSyntax == '\0') {
        connectionSyntax();
      }
      QVar9.m_data = (sender->className).d.ptr;
      QVar9.m_size = (sender->className).d.size;
      cVar3 = QtPrivate::QStringList_contains
                        ((QList *)&connectionSyntax::requiresStringSyntax,QVar9,CaseSensitive);
      CVar5 = StringBased;
      if ((cVar3 == '\0') &&
         (QVar10.m_data = (receiver->className).d.ptr, QVar10.m_size = (receiver->className).d.size,
         cVar3 = QtPrivate::QStringList_contains
                           ((QList *)&connectionSyntax::requiresStringSyntax,QVar10,CaseSensitive),
         cVar3 == '\0')) {
        lVar1 = (sender->name).d.size;
        lVar2 = (this->m_mainFormVarName).d.size;
        if ((lVar1 == lVar2) &&
           ((QVar6.m_data = (sender->name).d.ptr, QVar6.m_size = lVar1,
            QVar13.m_data = (this->m_mainFormVarName).d.ptr, QVar13.m_size = lVar2,
            cVar3 = QtPrivate::equalStrings(QVar6,QVar13), cVar3 != '\0' &&
            (QVar11.m_data = (sender->signature).d.ptr, QVar11.m_size = (sender->signature).d.size,
            cVar3 = QtPrivate::QStringList_contains
                              ((QList *)&this->m_customSignals,QVar11,CaseSensitive), cVar3 != '\0')
            ))) {
          return StringBased;
        }
        lVar1 = (receiver->name).d.size;
        lVar2 = (this->m_mainFormVarName).d.size;
        if (((lVar1 == lVar2) &&
            (QVar7.m_data = (receiver->name).d.ptr, QVar7.m_size = lVar1,
            QVar14.m_data = (this->m_mainFormVarName).d.ptr, QVar14.m_size = lVar2,
            cVar3 = QtPrivate::equalStrings(QVar7,QVar14), cVar3 != '\0')) &&
           (QVar12.m_data = (receiver->signature).d.ptr,
           QVar12.m_size = (receiver->signature).d.size,
           cVar3 = QtPrivate::QStringList_contains
                             ((QList *)&this->m_customSlots,QVar12,CaseSensitive), cVar3 != '\0')) {
          return StringBased;
        }
        CVar5 = MemberFunctionPtr;
        QVar8.m_data = (char *)0x2;
        QVar8.m_size = (qsizetype)&sender->signature;
        cVar3 = QString::endsWith(QVar8,0x1796ad);
        if (cVar3 == '\0') {
          bVar4 = isCustomWidget(this,&sender->className);
          CVar5 = StringBased;
          if (!bVar4) {
            bVar4 = isCustomWidget(this,&receiver->className);
            CVar5 = (ConnectionSyntax)!bVar4;
          }
        }
      }
    }
  }
  return CVar5;
}

Assistant:

ConnectionSyntax WriteInitialization::connectionSyntax(const language::SignalSlot &sender,
                                                       const language::SignalSlot &receiver) const
{
    if (m_option.forceMemberFnPtrConnectionSyntax)
        return ConnectionSyntax::MemberFunctionPtr;
    if (m_option.forceStringConnectionSyntax)
        return ConnectionSyntax::StringBased;
    // Auto mode: Use Qt 5 connection syntax for Qt classes and parameterless
    // connections. QAxWidget is special though since it has a fake Meta object.
    static const QStringList requiresStringSyntax{QStringLiteral("QAxWidget")};
    if (requiresStringSyntax.contains(sender.className)
        || requiresStringSyntax.contains(receiver.className)) {
        return ConnectionSyntax::StringBased;
    }

    if ((sender.name == m_mainFormVarName && m_customSignals.contains(sender.signature))
         || (receiver.name == m_mainFormVarName && m_customSlots.contains(receiver.signature))) {
        return ConnectionSyntax::StringBased;
    }

    return sender.signature.endsWith("()"_L1)
        || (!isCustomWidget(sender.className) && !isCustomWidget(receiver.className))
        ? ConnectionSyntax::MemberFunctionPtr : ConnectionSyntax::StringBased;
}